

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O1

void __thiscall
CPP::WriteInitialization::LayoutDefaultHandler::writeProperty
          (LayoutDefaultHandler *this,int p,QString *indent,QString *objectName,
          DomPropertyMap *properties,QString *propertyName,QString *setter,int defaultStyleValue,
          bool suppressDefault,QTextStream *str)

{
  int value;
  Node<QString,_DomProperty_*> *pNVar1;
  DomProperty **ppDVar2;
  DomProperty *pDVar3;
  long in_FS_OFFSET;
  bool bVar4;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((properties->d == (Data<QHashPrivate::Node<QString,_DomProperty_*>_> *)0x0) ||
     (pNVar1 = QHashPrivate::Data<QHashPrivate::Node<QString,_DomProperty_*>_>::findNode<QString>
                         (properties->d,propertyName), pNVar1 == (Node<QString,_DomProperty_*> *)0x0
     )) {
    ppDVar2 = (DomProperty **)0x0;
  }
  else {
    ppDVar2 = &pNVar1->value;
  }
  if (ppDVar2 == (DomProperty **)0x0) {
    pDVar3 = (DomProperty *)0x0;
  }
  else {
    pDVar3 = *ppDVar2;
  }
  if (pDVar3 == (DomProperty *)0x0) {
LAB_0011f797:
    bVar4 = false;
  }
  else {
    value = pDVar3->m_number;
    if ((suppressDefault) || (this->m_state[p] != 3)) {
      bVar4 = false;
    }
    else {
      bVar4 = value == this->m_defaultValues[p];
    }
    if (bVar4) goto LAB_0011f797;
    bVar4 = (this->m_state[p] & 3) == 0;
    if (defaultStyleValue == value && bVar4) {
      QTextStream::operator<<(str,"#ifndef Q_OS_MAC\n");
    }
    if (p == 0) {
      writeContentsMargins(indent,objectName,value,str);
    }
    else {
      anon_unknown.dwarf_a9171::writeSetter<int>(indent,objectName,setter,value,str);
    }
    if (defaultStyleValue == value && bVar4) {
      QTextStream::operator<<(str,"#endif\n");
    }
    bVar4 = true;
  }
  if (!bVar4 && !suppressDefault) {
    if ((this->m_state[p] & 2) == 0) {
      if ((this->m_state[p] & 1) != 0) {
        if (p == 0) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            writeContentsMargins(indent,objectName,this->m_defaultValues[p],str);
            return;
          }
        }
        else if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          anon_unknown.dwarf_a9171::writeSetter<int>
                    (indent,objectName,setter,this->m_defaultValues[p],str);
          return;
        }
        goto LAB_0011f8c1;
      }
    }
    else {
      local_50.d.d = this->m_functions[p].d.d;
      local_50.d.ptr = this->m_functions[p].d.ptr;
      local_50.d.size = this->m_functions[p].d.size;
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&((local_50.d.d)->super_QArrayData).ref_)->ref_)._q_value.
        super___atomic_base<int>._M_i =
             (((QArrayData *)&((local_50.d.d)->super_QArrayData).ref_)->ref_)._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      anon_unknown.dwarf_a9171::writeSetter<QString>(indent,objectName,setter,&local_50,str);
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_0011f8c1:
  __stack_chk_fail();
}

Assistant:

void WriteInitialization::LayoutDefaultHandler::writeProperty(int p, const QString &indent, const QString &objectName,
                                                              const DomPropertyMap &properties, const QString &propertyName, const QString &setter,
                                                              int defaultStyleValue, bool suppressDefault, QTextStream &str) const
{
    // User value
    if (const DomProperty *prop = properties.value(propertyName)) {
        const int value = prop->elementNumber();
        // Emulate the pre 4.3 behaviour: The value form default value was only used to determine
        // the default value, layout properties were always written
        const bool useLayoutFunctionPre43 = !suppressDefault && (m_state[p] == (HasDefaultFunction|HasDefaultValue)) && value == m_defaultValues[p];
        if (!useLayoutFunctionPre43) {
            bool ifndefMac = (!(m_state[p] & (HasDefaultFunction|HasDefaultValue))
                             && value == defaultStyleValue);
            if (ifndefMac)
                str << "#ifndef Q_OS_MAC\n";
            if (p == Margin) { // Use setContentsMargins for numeric values
                writeContentsMargins(indent, objectName, value, str);
            } else {
                writeSetter(indent, objectName, setter, value, str);
            }
            if (ifndefMac)
                str << "#endif\n";
            return;
        }
    }
    if (suppressDefault)
        return;
    // get default.
    if (m_state[p] & HasDefaultFunction) {
        // Do not use setContentsMargins to avoid repetitive evaluations.
        writeSetter(indent, objectName, setter, m_functions[p], str);
        return;
    }
    if (m_state[p] & HasDefaultValue) {
        if (p == Margin) { // Use setContentsMargins for numeric values
            writeContentsMargins(indent, objectName, m_defaultValues[p], str);
        } else {
            writeSetter(indent, objectName, setter, m_defaultValues[p], str);
        }
    }
}